

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O1

bool __thiscall Args::Arg::isMisspelledName(Arg *this,String *name,StringList *possibleNames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  undefined4 extraout_var_01;
  size_type *psVar5;
  String local_70;
  long *local_50 [2];
  long local_40 [2];
  
  iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[8])();
  if (*(long *)(CONCAT44(extraout_var,iVar3) + 8) != 0) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--","");
    iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[8])(this);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_50,*(ulong *)CONCAT44(extraout_var_00,iVar3));
    paVar1 = &local_70.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar4[3];
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_70._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    bVar2 = details::isMisspelledName(name,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (bVar2) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"--","");
      iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[8])(this);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,*(ulong *)CONCAT44(extraout_var_01,iVar3));
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar4[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_70._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)possibleNames,
                 &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const override
	{
		if( !argumentName().empty() )
		{
			if( details::isMisspelledName( name,
				String( SL( "--" ) ) + argumentName() ) )
			{
				possibleNames.push_back( String( SL( "--" ) ) + argumentName() );

				return true;
			}
		}

		return false;
	}